

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

void __thiscall
OptionParser::parseReportField(OptionParser *this,Network *network,int nTokens,string *tokens)

{
  string *s1;
  int iVar1;
  bool bVar2;
  int index;
  InputError *pIVar3;
  int iVar4;
  int iVar5;
  double lowerLimit_00;
  double upperLimit_00;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  Network *local_78;
  double local_70;
  double lowerLimit;
  double upperLimit;
  string local_58;
  int local_38;
  allocator local_31;
  int precision;
  
  local_38 = -1;
  local_70 = -1.0;
  lowerLimit = -1.0;
  upperLimit._4_4_ = nTokens;
  index = Utilities::findMatch(tokens,ReportFields::NodeFieldNames);
  if (index < 0) {
    index = Utilities::findMatch(tokens,ReportFields::LinkFieldNames);
    if (index < 0) {
      pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_118,(string *)tokens);
      InputError::InputError(pIVar3,3,&local_118);
      __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
    }
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
  }
  std::__cxx11::string::string((string *)&local_58,"YES",&local_31);
  s1 = tokens + 1;
  local_78 = network;
  upperLimit._0_4_ = iVar4;
  bVar2 = Utilities::match(s1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  iVar4 = -1;
  iVar5 = iVar4;
  if (bVar2) {
    iVar1 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_58,"NO",&local_31);
    bVar2 = Utilities::match(s1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    iVar1 = 0;
    if (!bVar2) {
      if (upperLimit._4_4_ < 3) {
        return;
      }
      std::__cxx11::string::string((string *)&local_58,"PRECISION",&local_31);
      bVar2 = Utilities::match(s1,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_58,"BELOW",&local_31);
        bVar2 = Utilities::match(s1,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        if (bVar2) {
          bVar2 = Utilities::parseNumber<double>(tokens + 2,&local_70);
          if (!bVar2) {
            pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string((string *)&local_d8,(string *)(tokens + 2));
            InputError::InputError(pIVar3,6,&local_d8);
            __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
          }
          lowerLimit_00 = local_70;
          upperLimit_00 = -1.0;
        }
        else {
          std::__cxx11::string::string((string *)&local_58,"ABOVE",&local_31);
          bVar2 = Utilities::match(s1,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          if (!bVar2) {
            pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string((string *)&local_98,(string *)s1);
            InputError::InputError(pIVar3,3,&local_98);
            __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
          }
          bVar2 = Utilities::parseNumber<double>(tokens + 2,&lowerLimit);
          if (!bVar2) {
            pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string((string *)&local_b8,(string *)(tokens + 2));
            InputError::InputError(pIVar3,6,&local_b8);
            __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
          }
          lowerLimit_00 = -1.0;
          upperLimit_00 = lowerLimit;
        }
        goto LAB_00136a28;
      }
      bVar2 = Utilities::parseNumber<int>(tokens + 2,&local_38);
      if (!bVar2) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_f8,(string *)(tokens + 2));
        InputError::InputError(pIVar3,6,&local_f8);
        __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
      }
      iVar1 = -1;
      iVar5 = local_38;
    }
  }
  iVar4 = iVar1;
  lowerLimit_00 = -1.0;
  upperLimit_00 = -1.0;
LAB_00136a28:
  Options::setReportFieldOption
            (&local_78->options,upperLimit._0_4_,index,iVar4,iVar5,lowerLimit_00,upperLimit_00);
  return;
}

Assistant:

void OptionParser::parseReportField(Network* network, int nTokens, string* tokens)
{
    int    type = Element::NODE;
    int    index = -1;
    int    enabled = -1;
    int    precision = -1;
    double lowerLimit = -1;
    double upperLimit = -1;

    // ... parse FieldName  YES/NO
    index = Utilities::findMatch(tokens[0], ReportFields::NodeFieldNames);
    if ( index < 0 )
    {
        type = Element::LINK;
        index = Utilities::findMatch(tokens[0], ReportFields::LinkFieldNames);
        if ( index < 0 ) throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
    }

    if ( Utilities::match(tokens[1], "YES") ) enabled = 1;
    else if ( Utilities::match(tokens[1], "NO") ) enabled = 0;
    else if ( nTokens < 3 ) return;

    // ... parse FieldName  PRECISION  number
    else if ( Utilities::match(tokens[1], "PRECISION") )
    {
        if ( !Utilities::parseNumber(tokens[2], precision) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }

    // ... parse FieldName  ABOVE/BELOW  number
    else if ( Utilities::match(tokens[1], "BELOW") )
    {
        if ( !Utilities::parseNumber(tokens[2], lowerLimit) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }
    else if ( Utilities::match(tokens[1], "ABOVE") )
    {
        if ( !Utilities::parseNumber(tokens[2], upperLimit) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);

    network->options.setReportFieldOption(
            type, index, enabled, precision, lowerLimit, upperLimit);
}